

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O3

void __thiscall PRED<TTA>::SecondScan(PRED<TTA> *this)

{
  int iVar1;
  Mat1i *pMVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  
  puVar4 = TTA::rtable_;
  uVar5 = 1;
  if (1 < TTA::length_) {
    uVar5 = 1;
    uVar7 = 1;
    do {
      if (uVar7 == puVar4[uVar7]) {
        uVar5 = uVar5 + 1;
        uVar9 = uVar5;
      }
      else {
        uVar9 = puVar4[puVar4[uVar7]];
      }
      puVar4[uVar7] = uVar9;
      uVar7 = uVar7 + 1;
    } while (uVar7 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar5;
  puVar4 = TTA::rtable_;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar10 = *(int *)&pMVar2->field_0x8;
  if (0 < iVar10) {
    lVar6 = *(long *)&pMVar2->field_0x10;
    lVar3 = **(long **)&pMVar2->field_0x48;
    lVar8 = 0;
    do {
      iVar1 = *(int *)&pMVar2->field_0xc;
      if ((long)iVar1 != 0) {
        lVar11 = 0;
        do {
          *(uint *)(lVar6 + lVar11) = puVar4[*(uint *)(lVar6 + lVar11)];
          lVar11 = lVar11 + 4;
        } while ((long)iVar1 * 4 != lVar11);
        iVar10 = *(int *)&pMVar2->field_0x8;
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + lVar3;
    } while (lVar8 < iVar10);
  }
  return;
}

Assistant:

static unsigned Flatten()
    {
        unsigned cur_label = 1;
        for (unsigned k = 1; k < length_; k++) {
            if (rtable_[k] == k) {
                cur_label++;
                rtable_[k] = cur_label;
            }
            else
                rtable_[k] = rtable_[rtable_[k]];
        }

        return cur_label;
    }